

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_helper<void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&),void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&)>
::_call<0,1>(cni_helper<void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  shared_ptr<cs::context_type> *in_RDX;
  function<void_(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  var *in_stack_000000f0;
  var *in_stack_00000100;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,0);
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             try_convert_and_check<const_std::shared_ptr<cs::context_type>_&,_const_std::shared_ptr<cs::context_type>_&,_std::shared_ptr<cs::context_type>,_0UL>
             ::convert(in_stack_00000100);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,1);
  try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  ::convert(in_stack_000000f0);
  std::
  function<void_(const_std::shared_ptr<cs::context_type>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(in_RSI,in_RDX,__args_1);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}